

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifresexists(bifcxdef *ctx,int argc)

{
  long lVar1;
  size_t sVar2;
  long in_RDI;
  runsdef val;
  int found;
  appctxdef *appctx;
  char resname [4096];
  uchar *p;
  int in_stack_ffffffffffffef9c;
  runcxdef *in_stack_ffffffffffffefa0;
  undefined8 in_stack_ffffffffffffefa8;
  char *pcVar3;
  dattyp typ;
  runcxdef *in_stack_ffffffffffffefb0;
  undefined7 in_stack_ffffffffffffefb8;
  undefined1 in_stack_ffffffffffffefbf;
  char *in_stack_ffffffffffffefc8;
  bifcxdef *in_stack_ffffffffffffefd0;
  char local_1018 [4096];
  size_t local_18;
  long local_8;
  
  typ = (dattyp)((ulong)in_stack_ffffffffffffefa8 >> 0x20);
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) != '\x03') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_ffffffffffffefa0,in_stack_ffffffffffffef9c);
  }
  local_18 = *(size_t *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  local_8 = in_RDI;
  bifcstr(in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,local_18,
          (uchar *)CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8));
  lVar1 = *(long *)(local_8 + 0xe0);
  if ((lVar1 != 0) && (*(long *)(lVar1 + 0x90) != 0)) {
    in_stack_ffffffffffffefb0 = *(runcxdef **)(lVar1 + 0x90);
    in_stack_ffffffffffffefa0 = *(runcxdef **)(lVar1 + 0x98);
    pcVar3 = local_1018;
    sVar2 = strlen(local_1018);
    (*(code *)in_stack_ffffffffffffefb0)(in_stack_ffffffffffffefa0,pcVar3,sVar2);
    typ = (dattyp)((ulong)pcVar3 >> 0x20);
  }
  runpush(in_stack_ffffffffffffefb0,typ,(runsdef *)in_stack_ffffffffffffefa0);
  return;
}

Assistant:

void bifresexists(bifcxdef *ctx, int argc)
{
    uchar *p;
    char resname[OSFNMAX];
    appctxdef *appctx;
    int found;
    runsdef val;
    
    /* check for proper arguments */
    bifcntargs(ctx, 1, argc);

    /* get the resource name string */
    p = runpopstr(ctx->bifcxrun);
    bifcstr(ctx, resname, (size_t)sizeof(resname), p);

    /* 
     *   if we have a host application context, and it provides a resource
     *   finder function, ask the resource finder if the resource is
     *   available; otherwise, report that the resource is not loadable,
     *   since we must not be running a version of the interpreter that
     *   supports external resource loading 
     */
    appctx = ctx->bifcxappctx;
    found = (appctx != 0
             && appctx->resfile_exists != 0
             && (*appctx->resfile_exists)(appctx->resfile_exists_ctx,
                                          resname, strlen(resname)));

    /* push the result */
    runpush(ctx->bifcxrun, runclog(found), &val);
}